

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O3

bool __thiscall
CriticalSection::insertNodes
          (CriticalSection *this,set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *nodes)

{
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *this_00;
  ulong uVar1;
  pair<std::_Rb_tree_iterator<Node_*>,_std::_Rb_tree_iterator<Node_*>_> pVar2;
  LockNode *local_20;
  
  this_00 = &this->nodes_;
  uVar1 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
  _M_insert_range_unique<std::_Rb_tree_const_iterator<Node*>>
            ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *)
             this_00,(nodes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<Node_*>)&(nodes->_M_t)._M_impl.super__Rb_tree_header);
  local_20 = this->lock_;
  pVar2 = std::
          _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
          ::equal_range(&this_00->_M_t,(key_type *)&local_20);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  return uVar1 < (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

bool CriticalSection::insertNodes(const std::set<Node *> &nodes) {
    auto sizeBefore = this->nodes_.size();
    this->nodes_.insert(nodes.begin(), nodes.end());
    this->nodes_.erase(lock_);
    auto sizeAfter = this->nodes_.size();
    return sizeBefore < sizeAfter;
}